

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O3

void usrc_writeUTrie2Struct
               (FILE *f,char *prefix,UTrie2 *pTrie,char *indexName,char *data32Name,char *postfix)

{
  if (prefix != (char *)0x0) {
    fputs(prefix,(FILE *)f);
  }
  if (pTrie->data32 == (uint32_t *)0x0) {
    fprintf((FILE *)f,"    %s,\n    %s+%ld,\n    NULL,\n",indexName,indexName,
            (long)pTrie->indexLength);
  }
  else {
    fprintf((FILE *)f,"    %s,\n    NULL,\n    %s,\n",indexName,data32Name);
  }
  fprintf((FILE *)f,
          "    %ld,\n    %ld,\n    0x%hx,\n    0x%hx,\n    0x%lx,\n    0x%lx,\n    0x%lx,\n    0x%lx,\n    NULL, 0, FALSE, FALSE, 0, NULL\n"
          ,(long)pTrie->indexLength,(long)pTrie->dataLength,
          (ulong)(uint)(int)(short)pTrie->index2NullOffset,
          (ulong)(uint)(int)(short)pTrie->dataNullOffset,(ulong)pTrie->initialValue,
          (ulong)pTrie->errorValue,(long)pTrie->highStart,(long)pTrie->highValueIndex);
  if (postfix != (char *)0x0) {
    fputs(postfix,(FILE *)f);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUTrie2Struct(FILE *f,
                       const char *prefix,
                       const UTrie2 *pTrie,
                       const char *indexName, const char *data32Name,
                       const char *postfix) {
    if(prefix!=NULL) {
        fputs(prefix, f);
    }
    if(pTrie->data32==NULL) {
        /* 16-bit trie */
        fprintf(
            f,
            "    %s,\n"         /* index */
            "    %s+%ld,\n"     /* data16 */
            "    NULL,\n",      /* data32 */
            indexName,
            indexName, 
            (long)pTrie->indexLength);
    } else {
        /* 32-bit trie */
        fprintf(
            f,
            "    %s,\n"         /* index */
            "    NULL,\n"       /* data16 */
            "    %s,\n",        /* data32 */
            indexName,
            data32Name);
    }
    fprintf(
        f,
        "    %ld,\n"            /* indexLength */
        "    %ld,\n"            /* dataLength */
        "    0x%hx,\n"          /* index2NullOffset */
        "    0x%hx,\n"          /* dataNullOffset */
        "    0x%lx,\n"          /* initialValue */
        "    0x%lx,\n"          /* errorValue */
        "    0x%lx,\n"          /* highStart */
        "    0x%lx,\n"          /* highValueIndex */
        "    NULL, 0, FALSE, FALSE, 0, NULL\n",
        (long)pTrie->indexLength, (long)pTrie->dataLength,
        (short)pTrie->index2NullOffset, (short)pTrie->dataNullOffset,
        (long)pTrie->initialValue, (long)pTrie->errorValue,
        (long)pTrie->highStart, (long)pTrie->highValueIndex);
    if(postfix!=NULL) {
        fputs(postfix, f);
    }
}